

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

int DumpHash(FConsoleCommand **table,bool aliases,char *pattern)

{
  bool bVar1;
  uint uVar2;
  FConsoleAlias *local_30;
  FConsoleCommand *cmd;
  int count;
  int bucket;
  char *pattern_local;
  bool aliases_local;
  FConsoleCommand **table_local;
  
  cmd._0_4_ = 0;
  for (cmd._4_4_ = 0; cmd._4_4_ < 0xfb; cmd._4_4_ = cmd._4_4_ + 1) {
    for (local_30 = (FConsoleAlias *)table[cmd._4_4_]; local_30 != (FConsoleAlias *)0x0;
        local_30 = (FConsoleAlias *)(local_30->super_FConsoleCommand).m_Next) {
      bVar1 = CheckWildcards(pattern,(local_30->super_FConsoleCommand).m_Name);
      if (bVar1) {
        uVar2 = (*(local_30->super_FConsoleCommand)._vptr_FConsoleCommand[2])();
        if ((uVar2 & 1) == 0) {
          if (!aliases) {
            cmd._0_4_ = (int)cmd + 1;
            FConsoleCommand::PrintCommand(&local_30->super_FConsoleCommand);
          }
        }
        else if (aliases) {
          cmd._0_4_ = (int)cmd + 1;
          FConsoleAlias::PrintAlias(local_30);
        }
      }
    }
  }
  return (int)cmd;
}

Assistant:

static int DumpHash (FConsoleCommand **table, bool aliases, const char *pattern=NULL)
{
	int bucket, count;
	FConsoleCommand *cmd;

	for (bucket = count = 0; bucket < FConsoleCommand::HASH_SIZE; bucket++)
	{
		cmd = table[bucket];
		while (cmd)
		{
			if (CheckWildcards (pattern, cmd->m_Name))
			{
				if (cmd->IsAlias())
				{
					if (aliases)
					{
						++count;
						static_cast<FConsoleAlias *>(cmd)->PrintAlias ();
					}
				}
				else if (!aliases)
				{
					++count;
					cmd->PrintCommand ();
				}
			}
			cmd = cmd->m_Next;
		}
	}
	return count;
}